

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inet.c
# Opt level: O0

int inet_ntop4(uchar *src,char *dst,size_t size)

{
  int iVar1;
  char local_38 [4];
  int l;
  char tmp [16];
  size_t size_local;
  char *dst_local;
  uchar *src_local;
  
  tmp._8_8_ = size;
  iVar1 = snprintf(local_38,0x10,"%u.%u.%u.%u",(ulong)*src,(ulong)src[1],(ulong)src[2],(uint)src[3])
  ;
  if ((iVar1 < 1) || ((ulong)tmp._8_8_ <= (ulong)(long)iVar1)) {
    src_local._4_4_ = -0x1c;
  }
  else {
    uv__strscpy(dst,local_38,tmp._8_8_);
    src_local._4_4_ = 0;
  }
  return src_local._4_4_;
}

Assistant:

static int inet_ntop4(const unsigned char *src, char *dst, size_t size) {
  static const char fmt[] = "%u.%u.%u.%u";
  char tmp[UV__INET_ADDRSTRLEN];
  int l;

  l = snprintf(tmp, sizeof(tmp), fmt, src[0], src[1], src[2], src[3]);
  if (l <= 0 || (size_t) l >= size) {
    return UV_ENOSPC;
  }
  uv__strscpy(dst, tmp, size);
  return 0;
}